

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

EncoderStatus __thiscall mp3_encoder::Encoder::encode(Encoder *this)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  FILE *__stream;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  FILE *__s;
  size_t sVar5;
  EncoderStatus EVar6;
  string mp3_file_path;
  
  __stream = fopen((this->m_wavFilePath)._M_dataplus._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    EVar6 = OpenFileError;
  }
  else {
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                      (&this->m_wavFilePath,'.',0xffffffffffffffff);
    __str = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (&this->m_wavFilePath,sVar4 + 1,3,"mp3");
    std::__cxx11::string::string((string *)&mp3_file_path,__str);
    __s = fopen(mp3_file_path._M_dataplus._M_p,"wb");
    if (__s == (FILE *)0x0) {
      EVar6 = OpenFileError;
    }
    else {
      fread(&this->m_wavHeader,0x2c,1,__stream);
      do {
        sVar5 = fread((this->m_wavBuffer).super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(ulong)((uint)(this->m_wavHeader).numChannels * 2),0x1000,__stream);
        if (sVar5 == 0) {
          iVar3 = lame_encode_flush(this->m_lameFlags,
                                    (this->m_mp3Buffer).
                                    super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr,0x1000);
        }
        else {
          peVar1 = (this->m_wavBuffer).super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar2 = (this->m_mp3Buffer).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          if ((this->m_wavHeader).numChannels == 1) {
            iVar3 = lame_encode_buffer(this->m_lameFlags,peVar1,0,sVar5 & 0xffffffff,peVar2,0x1000);
          }
          else {
            iVar3 = lame_encode_buffer_interleaved
                              (this->m_lameFlags,peVar1,sVar5 & 0xffffffff,peVar2,0x1000);
          }
        }
        fwrite((this->m_mp3Buffer).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(long)iVar3,1,__s);
      } while (sVar5 != 0);
      fclose(__stream);
      fclose(__s);
      EVar6 = StatusOk;
    }
    std::__cxx11::string::~string((string *)&mp3_file_path);
  }
  return EVar6;
}

Assistant:

EncoderStatus Encoder::encode()
    {
        auto const wavFile = fopen(m_wavFilePath.c_str(), "rb");
        if(!wavFile)
        {
            return EncoderStatus::OpenFileError;
        }

        std::string mp3_file_path = m_wavFilePath.replace(m_wavFilePath.find_last_of('.') + 1, 3, "mp3");
        FILE* mp3File = fopen(mp3_file_path.c_str(), "wb");
        if(!mp3File)
        {
            return EncoderStatus::OpenFileError;
        }

        fread(&m_wavHeader, sizeof(wav_header_t), 1, wavFile);

        auto bytesRead    = std::size_t{};
        auto bytesWritten = std::size_t{};

        do
        {
            bytesRead = fread(m_wavBuffer.get(), m_wavHeader.numChannels * sizeof(short), CHUNK_SIZE, wavFile);

            if (bytesRead != 0)
            {
                if (m_wavHeader.numChannels == 1)
                {
                    bytesWritten = lame_encode_buffer(m_lameFlags, m_wavBuffer.get(), nullptr, static_cast<int>(bytesRead), m_mp3Buffer.get(), CHUNK_SIZE);
                }
                else
                {
                    bytesWritten = lame_encode_buffer_interleaved(m_lameFlags, m_wavBuffer.get(), static_cast<int>(bytesRead), m_mp3Buffer.get(), CHUNK_SIZE);
                }
            }
            else
            {
                bytesWritten = lame_encode_flush(m_lameFlags, m_mp3Buffer.get(), CHUNK_SIZE);
            }

            if (bytesWritten < 0)
            {
                fclose(wavFile);
                fclose(mp3File);
                return EncoderStatus::EncodeBufferError;
            }

            fwrite(m_mp3Buffer.get(), bytesWritten, 1, mp3File);

        } while (bytesRead != 0);

        fclose(wavFile);
        fclose(mp3File);

        return EncoderStatus::StatusOk;
    }